

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

_Bool duckdb_je_tsd_tcache_data_init
                (tsd_t *tsd,arena_t *arena,cache_bin_info_t *duckdb_je_tcache_bin_info)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  _Bool _Var4;
  atomic_p_t arena_00;
  ulong uVar5;
  arena_t *arena_01;
  arena_t *extraout_RAX;
  _Bool internal;
  ulong uVar6;
  cache_bin_info_t *in_R8;
  rtree_ctx_t *rtree_ctx;
  size_t usize;
  rtree_metadata_t rVar7;
  size_t alignment;
  size_t size;
  rtree_contents_t local_48;
  
  duckdb_je_cache_bin_info_compute_alloc
            (duckdb_je_tcache_bin_info,
             (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).tcache_nbins,
             &size,&alignment);
  _Var4 = duckdb_je_cache_bin_stack_use_thp();
  if (_Var4) {
    arena_00.repr = duckdb_je_b0_alloc_tcache_stack((tsdn_t *)tsd,size);
    if ((arena_t *)arena_00.repr == (arena_t *)0x0) {
      arena_00.repr = (arena_t *)0x0;
      goto LAB_00e772e7;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar5 = -alignment & (size + alignment) - 1;
      if (uVar5 < 0x1001) {
        usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar5 + 7 >> 3]];
      }
      else {
        if (0x7000000000000000 < uVar5) goto LAB_00e771b6;
        uVar6 = uVar5 * 2 - 1;
        lVar3 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar6 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
        usize = ~uVar6 + uVar5 & uVar6;
      }
      uVar5 = 0x4000;
      if (0x3fff < usize) goto LAB_00e771bb;
    }
    else if (alignment < 0x7000000000000001) {
      uVar5 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar5 = size * 2 - 1;
          lVar3 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          uVar5 = -1L << (0x3c - ((byte)lVar3 ^ 0x3f) & 0x3f);
          uVar5 = ~uVar5 + size & uVar5;
        }
        else {
          uVar5 = 0;
        }
        if (uVar5 < size) goto LAB_00e771b6;
      }
LAB_00e771bb:
      usize = 0;
      if (uVar5 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar5) -
                   0x1000) {
        usize = uVar5;
      }
    }
    else {
LAB_00e771b6:
      usize = 0;
    }
    size = usize;
    arena_01 = arena_get((tsdn_t *)0x0,0,true);
    in_R8 = (cache_bin_info_t *)0x1;
    arena_00.repr =
         duckdb_je_arena_palloc
                   ((tsdn_t *)tsd,arena_01,usize,alignment,true,usize < 0x3801,(tcache_t *)0x0);
    if ((arena_t *)arena_00.repr == (arena_t *)0x0) goto LAB_00e772e7;
    rtree_read(&local_48,(tsdn_t *)tsd,
               (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
               (rtree_ctx_t *)arena_00.repr,(uintptr_t)in_R8);
    uVar5 = (ulong)((uint)(local_48.edata)->e_bits & 0xfff);
    pvVar2 = duckdb_je_arenas[uVar5].repr;
    rVar7 = rtree_metadata_read((tsdn_t *)tsd,
                                (rtree_t *)
                                &tsd->
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                                (rtree_ctx_t *)arena_00.repr,uVar5);
    LOCK();
    plVar1 = (long *)((long)pvVar2 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar7.szind];
    UNLOCK();
  }
  tcache_init((tsd_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
              (tcache_slow_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
              (tcache_t *)arena_00.repr,duckdb_je_tcache_bin_info,in_R8);
  (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena = (arena_t *)0x0;
  if (duckdb_je_malloc_init_state == malloc_init_initialized) {
    arena_00.repr = arena;
    if ((arena == (arena_t *)0x0) &&
       (arena_00.repr = arena_choose_impl(tsd,(arena_t *)0x0,internal),
       (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena !=
       (arena_t *)0x0)) goto LAB_00e772e7;
  }
  else {
    arena_00 = duckdb_je_arenas[0];
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena_00.repr = (arena_t *)0x0;
    }
  }
  duckdb_je_tcache_arena_associate
            ((tsdn_t *)tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
             &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
             (arena_t *)arena_00.repr);
  arena_00.repr = extraout_RAX;
LAB_00e772e7:
  return SUB81(arena_00.repr,0);
}

Assistant:

static bool
tsd_tcache_data_init(tsd_t *tsd, arena_t *arena,
    const cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX]) {
	assert(tcache_bin_info != NULL);
	return tsd_tcache_data_init_impl(tsd, arena, tcache_bin_info);
}